

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool anon_unknown.dwarf_f716::is_root_separator(string_type *str,size_type pos)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  value_type *pvVar4;
  ulong uVar5;
  bool local_22;
  ulong local_20;
  size_type pos_local;
  string_type *str_local;
  
  uVar3 = std::__cxx11::string::empty();
  bVar2 = false;
  if ((uVar3 & 1) == 0) {
    pvVar4 = (value_type *)std::__cxx11::string::operator[]((ulong)str);
    bVar1 = is_separator(*pvVar4);
    bVar2 = false;
    if (bVar1) {
      bVar2 = true;
    }
  }
  local_20 = pos;
  if (bVar2) {
    while( true ) {
      local_22 = false;
      if (local_20 != 0) {
        pvVar4 = (value_type *)std::__cxx11::string::operator[]((ulong)str);
        local_22 = is_separator(*pvVar4);
      }
      if (local_22 == false) break;
      local_20 = local_20 - 1;
    }
    if (local_20 == 0) {
      str_local._7_1_ = true;
    }
    else {
      if (2 < local_20) {
        pvVar4 = (value_type *)std::__cxx11::string::operator[]((ulong)str);
        bVar2 = is_separator(*pvVar4);
        if (bVar2) {
          pvVar4 = (value_type *)std::__cxx11::string::operator[]((ulong)str);
          bVar2 = is_separator(*pvVar4);
          if (bVar2) {
            uVar5 = std::__cxx11::string::find_first_of((char *)str,0x120c02);
            return uVar5 == local_20;
          }
        }
      }
      str_local._7_1_ = false;
    }
    return str_local._7_1_;
  }
  __assert_fail("(!str.empty() && is_separator(str[pos]))&&(\"precondition violation\")",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Naios[P]boost-minimal-dist/libs/filesystem/src/path.cpp"
                ,0x205,
                "bool (anonymous namespace)::is_root_separator(const string_type &, size_type)");
}

Assistant:

bool is_root_separator(const string_type & str, size_type pos)
    // pos is position of the separator
  {
    BOOST_ASSERT_MSG(!str.empty() && is_separator(str[pos]),
      "precondition violation");

    // subsequent logic expects pos to be for leftmost slash of a set
    while (pos > 0 && is_separator(str[pos-1]))
      --pos;

    //  "/" [...]
    if (pos == 0)  
      return true;

# ifdef BOOST_WINDOWS_API
    //  "c:/" [...]
    if (pos == 2 && is_letter(str[0]) && str[1] == colon)  
      return true;
# endif

    //  "//" name "/"
    if (pos < 3 || !is_separator(str[0]) || !is_separator(str[1]))
      return false;

    return str.find_first_of(separators, 2) == pos;
  }